

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild.cpp
# Opt level: O1

double __thiscall FNodeBuilder::InterceptVector(FNodeBuilder *this,node_t *splitter,FPrivSeg *seg)

{
  FPrivVert *pFVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  pFVar1 = (this->Vertices).Array;
  dVar4 = (double)pFVar1[seg->v1].super_FSimpleVert.x;
  dVar2 = (double)pFVar1[seg->v1].super_FSimpleVert.y;
  dVar3 = ((double)pFVar1[seg->v2].super_FSimpleVert.x - dVar4) * (double)splitter->dy -
          ((double)pFVar1[seg->v2].super_FSimpleVert.y - dVar2) * (double)splitter->dx;
  if ((dVar3 == 0.0) && (!NAN(dVar3))) {
    return 0.0;
  }
  return ((dVar2 - (double)splitter->y) * (double)splitter->dx +
         ((double)splitter->x - dVar4) * (double)splitter->dy) / dVar3;
}

Assistant:

double FNodeBuilder::InterceptVector (const node_t &splitter, const FPrivSeg &seg)
{
	double v2x = (double)Vertices[seg.v1].x;
	double v2y = (double)Vertices[seg.v1].y;
	double v2dx = (double)Vertices[seg.v2].x - v2x;
	double v2dy = (double)Vertices[seg.v2].y - v2y;
	double v1dx = (double)splitter.dx;
	double v1dy = (double)splitter.dy;

	double den = v1dy*v2dx - v1dx*v2dy;

	if (den == 0.0)
		return 0;		// parallel

	double v1x = (double)splitter.x;
	double v1y = (double)splitter.y;

	double num = (v1x - v2x)*v1dy + (v2y - v1y)*v1dx;
	double frac = num / den;

	return frac;
}